

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb_test_helper.c
# Opt level: O3

MMDB_lookup_result_s *
lookup_string_ok(MMDB_lookup_result_s *__return_storage_ptr__,MMDB_s *mmdb,char *ip,char *file,
                char *mode_desc)

{
  undefined8 in_RAX;
  int mmdb_error;
  int gai_error;
  undefined8 local_38;
  
  local_38 = in_RAX;
  MMDB_lookup_string(__return_storage_ptr__,mmdb,ip,(int *)((long)&local_38 + 4),(int *)&local_38);
  test_lookup_errors(local_38._4_4_,(int)local_38,"MMDB_lookup_string",ip,file,mode_desc);
  return __return_storage_ptr__;
}

Assistant:

MMDB_lookup_result_s lookup_string_ok(MMDB_s *mmdb,
                                      const char *ip,
                                      const char *file,
                                      const char *mode_desc) {
    int gai_error, mmdb_error;
    MMDB_lookup_result_s result =
        MMDB_lookup_string(mmdb, ip, &gai_error, &mmdb_error);

    test_lookup_errors(
        gai_error, mmdb_error, "MMDB_lookup_string", ip, file, mode_desc);

    return result;
}